

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

void __thiscall
CNetBan::MakeBanInfo<NETADDR>
          (CNetBan *this,CBan<NETADDR> *pBan,char *pBuf,uint BuffSize,int Type,int *pLastInfoQuery)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *format;
  long in_FS_OFFSET;
  char aTemp [256];
  char aBuf [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pBan == (CBan<NETADDR> *)0x0 || pBuf == (char *)0x0) {
    if (BuffSize != 0) {
      *pBuf = '\0';
    }
    goto LAB_001b7026;
  }
  if (Type == 0) {
    str_copy(aBuf,"You have been banned",0x100);
  }
  else {
    if (Type == 3) {
      pcVar4 = NetToString(this,&pBan->m_Data,aTemp,0x100);
      format = "unbanned %s";
    }
    else if (Type == 2) {
      pcVar4 = NetToString(this,&pBan->m_Data,aTemp,0x100);
      format = "banned %s";
    }
    else {
      if (Type != 1) {
        aBuf[0] = '\0';
        goto LAB_001b6fa4;
      }
      pcVar4 = NetToString(this,&pBan->m_Data,aTemp,0x100);
      format = "%s banned";
    }
    str_format(aBuf,0x100,format,pcVar4);
  }
LAB_001b6fa4:
  iVar2 = time_timestamp();
  iVar3 = (pBan->m_Info).m_Expires;
  if (iVar3 == -1) {
    pcVar4 = "%s for life (%s)";
LAB_001b6fd5:
    str_format(pBuf,BuffSize,pcVar4,aBuf,(pBan->m_Info).m_aReason);
  }
  else {
    iVar3 = iVar3 - iVar2;
    if (iVar3 < 0x3d) {
      pcVar4 = "%s for 1 minute (%s)";
      goto LAB_001b6fd5;
    }
    str_format(pBuf,BuffSize,"%s for %d minutes (%s)",aBuf,(ulong)(iVar3 + 0x3b) / 0x3c,
               (pBan->m_Info).m_aReason);
  }
  if (pLastInfoQuery != (int *)0x0) {
    *pLastInfoQuery = (pBan->m_Info).m_LastInfoQuery;
    (pBan->m_Info).m_LastInfoQuery = iVar2;
  }
LAB_001b7026:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::MakeBanInfo(CBan<T> *pBan, char *pBuf, unsigned BuffSize, int Type, int *pLastInfoQuery)
{
	if(pBan == 0 || pBuf == 0)
	{
		if(BuffSize > 0)
			pBuf[0] = 0;
		return;
	}

	// build type based part
	char aBuf[256];
	if(Type == MSGTYPE_PLAYER)
		str_copy(aBuf, "You have been banned", sizeof(aBuf));
	else
	{
		char aTemp[256];
		switch(Type)
		{
		case MSGTYPE_LIST:
			str_format(aBuf, sizeof(aBuf), "%s banned", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANADD:
			str_format(aBuf, sizeof(aBuf), "banned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANREM:
			str_format(aBuf, sizeof(aBuf), "unbanned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		default:
			aBuf[0] = 0;
		}
	}

	// add info part
	int Time = time_timestamp();
	if(pBan->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER)
	{
		int Mins = ((pBan->m_Info.m_Expires-Time) + 59) / 60;
		if(Mins <= 1)
			str_format(pBuf, BuffSize, "%s for 1 minute (%s)", aBuf, pBan->m_Info.m_aReason);
		else
			str_format(pBuf, BuffSize, "%s for %d minutes (%s)", aBuf, Mins, pBan->m_Info.m_aReason);
	}
	else
		str_format(pBuf, BuffSize, "%s for life (%s)", aBuf, pBan->m_Info.m_aReason);

	if(pLastInfoQuery)
	{
		*pLastInfoQuery = pBan->m_Info.m_LastInfoQuery;
		pBan->m_Info.m_LastInfoQuery = Time;
	}
}